

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::WorkGroupIDCase::~WorkGroupIDCase(WorkGroupIDCase *this)

{
  ComputeBuiltinVarCase::~ComputeBuiltinVarCase(&this->super_ComputeBuiltinVarCase);
  operator_delete(this,0xb0);
  return;
}

Assistant:

WorkGroupIDCase (tcu::TestContext& context)
		: ComputeBuiltinVarCase(context, "work_group_id", "gl_WorkGroupID", glu::TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1, 1, 1), UVec3(1, 1, 1)));
		m_subCases.push_back(SubCase(UVec3(1, 1, 1), UVec3(52, 1, 1)));
		m_subCases.push_back(SubCase(UVec3(1, 1, 1), UVec3(1, 39, 1)));
		m_subCases.push_back(SubCase(UVec3(1, 1, 1), UVec3(1, 1, 78)));
		m_subCases.push_back(SubCase(UVec3(1, 1, 1), UVec3(4, 7, 11)));
		m_subCases.push_back(SubCase(UVec3(2, 3, 4), UVec3(4, 7, 11)));
	}